

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_fft.c
# Opt level: O2

int WebRtcSpl_ComplexIFFT(int16_t *frfi,int stages,int mode)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ulong uVar5;
  int16_t iVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  sbyte sVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  
  if ((uint)stages < 0xb) {
    uVar18 = (ulong)(1 << ((byte)stages & 0x1f));
    iVar7 = 0;
    bVar9 = 9;
    uVar12 = 1;
    while (uVar12 < uVar18) {
      iVar6 = (*WebRtcSpl_MaxAbsValueW16)(frfi,uVar18 * 2);
      sVar10 = 0x3505 < iVar6;
      uVar11 = (uint)(byte)sVar10;
      if (0x6a0a < iVar6) {
        sVar10 = 2;
      }
      iVar16 = uVar11 * 0x2000 + 0x2000 << (0x6a0a < iVar6);
      uVar5 = uVar12 * 2;
      if (mode == 0) {
        for (uVar8 = 0; uVar8 != uVar12; uVar8 = uVar8 + 1) {
          lVar14 = uVar8 << (bVar9 & 0x3f);
          sVar1 = kSinTable1024[lVar14 + 0x100];
          sVar2 = kSinTable1024[lVar14];
          for (uVar13 = uVar8; uVar13 < uVar18; uVar13 = uVar13 + uVar5) {
            iVar15 = (int)frfi[uVar12 * 2 + uVar13 * 2] * (int)sVar1 -
                     (int)frfi[uVar12 * 2 + uVar13 * 2 + 1] * (int)sVar2 >> 0xf;
            sVar3 = frfi[uVar13 * 2];
            iVar16 = (int)frfi[uVar12 * 2 + uVar13 * 2] * (int)sVar2 +
                     (int)frfi[uVar12 * 2 + uVar13 * 2 + 1] * (int)sVar1 >> 0xf;
            sVar4 = frfi[uVar13 * 2 + 1];
            frfi[uVar12 * 2 + uVar13 * 2] = (int16_t)(sVar3 - iVar15 >> sVar10);
            frfi[uVar12 * 2 + uVar13 * 2 + 1] = (int16_t)(sVar4 - iVar16 >> sVar10);
            frfi[uVar13 * 2] = (int16_t)(iVar15 + sVar3 >> sVar10);
            frfi[uVar13 * 2 + 1] = (int16_t)(iVar16 + sVar4 >> sVar10);
          }
        }
      }
      else {
        sVar10 = sVar10 + 0xe;
        for (uVar8 = 0; uVar8 != uVar12; uVar8 = uVar8 + 1) {
          lVar14 = uVar8 << (bVar9 & 0x3f);
          sVar1 = kSinTable1024[lVar14 + 0x100];
          sVar2 = kSinTable1024[lVar14];
          for (uVar13 = uVar8; uVar13 < uVar18; uVar13 = uVar13 + uVar5) {
            iVar17 = ((int)frfi[uVar12 * 2 + uVar13 * 2] * (int)sVar1 -
                     (int)sVar2 * (int)frfi[uVar12 * 2 + uVar13 * 2 + 1]) + 1 >> 1;
            iVar15 = (int)frfi[uVar12 * 2 + uVar13 * 2] * (int)sVar2 +
                     (int)frfi[uVar12 * 2 + uVar13 * 2 + 1] * (int)sVar1 + 1 >> 1;
            sVar3 = frfi[uVar13 * 2 + 1];
            iVar19 = frfi[uVar13 * 2] * 0x4000 + iVar16;
            frfi[uVar12 * 2 + uVar13 * 2] = (int16_t)(iVar19 - iVar17 >> sVar10);
            frfi[uVar12 * 2 + uVar13 * 2 + 1] =
                 (int16_t)((iVar16 - iVar15) + sVar3 * 0x4000 >> sVar10);
            frfi[uVar13 * 2] = (int16_t)(iVar19 + iVar17 >> sVar10);
            frfi[uVar13 * 2 + 1] = (int16_t)(iVar15 + iVar16 + sVar3 * 0x4000 >> sVar10);
          }
        }
      }
      iVar7 = iVar7 + uVar11 + (uint)(0x6a0a < iVar6);
      bVar9 = bVar9 - 1;
      uVar12 = uVar5;
    }
  }
  else {
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

int WebRtcSpl_ComplexIFFT(int16_t frfi[], int stages, int mode)
{
    size_t i, j, l, istep, n, m;
    int k, scale, shift;
    int16_t wr, wi;
    int32_t tr32, ti32, qr32, qi32;
    int32_t tmp32, round2;

    /* The 1024-value is a constant given from the size of kSinTable1024[],
     * and should not be changed depending on the input parameter 'stages'
     */
    n = 1 << stages;
    if (n > 1024)
        return -1;

    scale = 0;

    l = 1;
    k = 10 - 1; /* Constant for given kSinTable1024[]. Do not change
         depending on the input parameter 'stages' */

    while (l < n)
    {
        // variable scaling, depending upon data
        shift = 0;
        round2 = 8192;

        tmp32 = WebRtcSpl_MaxAbsValueW16(frfi, 2 * n);
        if (tmp32 > 13573)
        {
            shift++;
            scale++;
            round2 <<= 1;
        }
        if (tmp32 > 27146)
        {
            shift++;
            scale++;
            round2 <<= 1;
        }

        istep = l << 1;

        if (mode == 0)
        {
            // mode==0: Low-complexity and Low-accuracy mode
            for (m = 0; m < l; ++m)
            {
                j = m << k;

                /* The 256-value is a constant given as 1/4 of the size of
                 * kSinTable1024[], and should not be changed depending on the input
                 * parameter 'stages'. It will result in 0 <= j < N_SINE_WAVE/2
                 */
                wr = kSinTable1024[j + 256];
                wi = kSinTable1024[j];

                for (i = m; i < n; i += istep)
                {
                    j = i + l;

                    tr32 = (wr * frfi[2 * j] - wi * frfi[2 * j + 1]) >> 15;

                    ti32 = (wr * frfi[2 * j + 1] + wi * frfi[2 * j]) >> 15;

                    qr32 = (int32_t)frfi[2 * i];
                    qi32 = (int32_t)frfi[2 * i + 1];
                    frfi[2 * j] = (int16_t)((qr32 - tr32) >> shift);
                    frfi[2 * j + 1] = (int16_t)((qi32 - ti32) >> shift);
                    frfi[2 * i] = (int16_t)((qr32 + tr32) >> shift);
                    frfi[2 * i + 1] = (int16_t)((qi32 + ti32) >> shift);
                }
            }
        } else
        {
            // mode==1: High-complexity and High-accuracy mode

            for (m = 0; m < l; ++m)
            {
                j = m << k;

                /* The 256-value is a constant given as 1/4 of the size of
                 * kSinTable1024[], and should not be changed depending on the input
                 * parameter 'stages'. It will result in 0 <= j < N_SINE_WAVE/2
                 */
                wr = kSinTable1024[j + 256];
                wi = kSinTable1024[j];

#ifdef WEBRTC_ARCH_ARM_V7
                int32_t wri = 0;
                __asm __volatile("pkhbt %0, %1, %2, lsl #16" : "=r"(wri) :
                    "r"((int32_t)wr), "r"((int32_t)wi));
#endif

                for (i = m; i < n; i += istep)
                {
                    j = i + l;

#ifdef WEBRTC_ARCH_ARM_V7
                    register int32_t frfi_r;
                    __asm __volatile(
                      "pkhbt %[frfi_r], %[frfi_even], %[frfi_odd], lsl #16\n\t"
                      "smlsd %[tr32], %[wri], %[frfi_r], %[cifftrnd]\n\t"
                      "smladx %[ti32], %[wri], %[frfi_r], %[cifftrnd]\n\t"
                      :[frfi_r]"=&r"(frfi_r),
                       [tr32]"=&r"(tr32),
                       [ti32]"=r"(ti32)
                      :[frfi_even]"r"((int32_t)frfi[2*j]),
                       [frfi_odd]"r"((int32_t)frfi[2*j +1]),
                       [wri]"r"(wri),
                       [cifftrnd]"r"(CIFFTRND)
                    );
#else

                    tr32 = wr * frfi[2 * j] - wi * frfi[2 * j + 1] + CIFFTRND;

                    ti32 = wr * frfi[2 * j + 1] + wi * frfi[2 * j] + CIFFTRND;
#endif
                    tr32 >>= 15 - CIFFTSFT;
                    ti32 >>= 15 - CIFFTSFT;

                    qr32 = ((int32_t)frfi[2 * i]) << CIFFTSFT;
                    qi32 = ((int32_t)frfi[2 * i + 1]) << CIFFTSFT;

                    frfi[2 * j] = (int16_t)(
                        (qr32 - tr32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * j + 1] = (int16_t)(
                        (qi32 - ti32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * i] = (int16_t)(
                        (qr32 + tr32 + round2) >> (shift + CIFFTSFT));
                    frfi[2 * i + 1] = (int16_t)(
                        (qi32 + ti32 + round2) >> (shift + CIFFTSFT));
                }
            }

        }
        --k;
        l = istep;
    }
    return scale;
}